

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
     *this,int i)

{
  FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar6;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar7;
  double *pdVar8;
  double *pdVar9;
  value_type vVar10;
  
  vVar10 = FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
           ::dx(&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).left_;
  pFVar2 = (pFVar1->fadexpr_).right_;
  pFVar3 = (this->right_->fadexpr_).right_;
  pdVar9 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar9 = (pFVar2->dx_).ptr_to_data + i;
  }
  pdVar8 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar8 = (pFVar3->dx_).ptr_to_data + i;
  }
  pFVar4 = (this->left_->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  pFVar6 = (this->left_->fadexpr_).right_;
  pFVar7 = (pFVar6->fadexpr_).left_;
  return vVar10 * (((double)(pFVar1->fadexpr_).left_.constant_ - pFVar2->val_) + pFVar3->val_) +
         ((double)(pFVar7->fadexpr_).left_.constant_ + ((pFVar7->fadexpr_).right_)->val_ +
         ((pFVar6->fadexpr_).right_)->val_) *
         (((double)(pFVar5->fadexpr_).left_.constant_ - ((pFVar5->fadexpr_).right_)->val_) +
         ((pFVar4->fadexpr_).right_)->val_) * (*pdVar8 - *pdVar9);
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}